

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsNumber.c
# Opt level: O3

void JsNumberInit(JsVm *vm)

{
  JsObject *pJVar1;
  JsObject *pJVar2;
  JsValue *pJVar3;
  JsObject *pJVar4;
  
  pJVar1 = JsCreateStandardFunctionObject((JsObject *)0x0,(JsList)0x0,1);
  pJVar2 = JsCreateNumberObject((JsObject *)0x0,0.0);
  pJVar1->Call = JsNumberConstCall;
  pJVar1->Construct = JsNumberConstConstruct;
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_OBJECT;
  (pJVar3->u).object = pJVar2;
  (*pJVar1->Put)(pJVar1,"prototype",pJVar3,7);
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_NUMBER;
  (pJVar3->u).number = NAN;
  (*pJVar1->Put)(pJVar1,"NaN",pJVar3,7);
  JsMalloc(0x18);
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_OBJECT;
  (pJVar3->u).object = pJVar1;
  (*pJVar2->Put)(pJVar2,"constructor",pJVar3,2);
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_OBJECT;
  pJVar4 = JsCreateStandardFunctionObject((JsObject *)0x0,(JsList)0x0,0);
  (pJVar3->u).object = pJVar4;
  pJVar4->Call = JsNumberProtoToString;
  (*pJVar2->Put)(pJVar2,"toString",pJVar3,2);
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_OBJECT;
  pJVar4 = JsCreateStandardFunctionObject((JsObject *)0x0,(JsList)0x0,0);
  (pJVar3->u).object = pJVar4;
  pJVar4->Call = JsNumberProtoValueOf;
  (*pJVar2->Put)(pJVar2,"valueOf",pJVar3,2);
  pJVar3 = (JsValue *)JsMalloc(0x18);
  pJVar3->type = JS_OBJECT;
  (pJVar3->u).object = pJVar1;
  (*vm->Global->Put)(vm->Global,"Number",pJVar3,7);
  return;
}

Assistant:

void JsNumberInit(struct JsVm* vm){
	
	struct JsObject* number = JsCreateStandardFunctionObject(NULL,NULL,TRUE);
	struct JsObject* number_proto = JsCreateNumberObject(NULL,0);
	
	JsNumberFunctionInit(number,number_proto);
	JsNumberProtoInit(number,number_proto);
	struct JsValue* v = (struct JsValue*)JsMalloc(sizeof(struct JsValue));
	v->type = JS_OBJECT;
	v->u.object = number;
	(*vm->Global->Put)(vm->Global,"Number",v,JS_OBJECT_ATTR_STRICT);
}